

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWhileCommand.cxx
# Opt level: O3

bool __thiscall
cmWhileFunctionBlocker::IsFunctionBlocked
          (cmWhileFunctionBlocker *this,cmListFileFunction *lff,cmMakefile *mf,
          cmExecutionStatus *inStatus)

{
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *inArgs;
  long *plVar1;
  long lVar2;
  MessageType MVar3;
  pointer pcVar4;
  bool bVar5;
  int iVar6;
  pointer pcVar7;
  ulong uVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  pointer pcVar10;
  ulong uVar11;
  MessageType messageType;
  string err;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> expandedArguments;
  string errorString;
  cmConditionEvaluator conditionEvaluator;
  MessageType local_c4;
  cmMakefile *local_c0;
  string local_b8;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> local_98;
  undefined1 local_80 [16];
  undefined1 local_70 [32];
  pointer local_50;
  cmConditionEvaluator local_48;
  
  iVar6 = cmsys::SystemTools::Strucmp((lff->super_cmListFileContext).Name._M_dataplus._M_p,"while");
  if (iVar6 == 0) {
    this->Depth = this->Depth + 1;
  }
  else {
    iVar6 = cmsys::SystemTools::Strucmp
                      ((lff->super_cmListFileContext).Name._M_dataplus._M_p,"endwhile");
    if (iVar6 == 0) {
      if (this->Depth == 0) {
        cmMakefile::RemoveFunctionBlocker
                  ((cmMakefile *)local_80,(cmFunctionBlocker *)mf,(cmListFileFunction *)this);
        if ((Internals *)local_80._0_8_ == (Internals *)0x0) {
          return false;
        }
        local_70._16_8_ = local_80._0_8_;
        local_80._0_8_ = local_70;
        local_80._8_8_ = 0;
        local_70[0] = _S_red;
        local_98.
        super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_98.
        super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_98.
        super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        inArgs = &this->Args;
        cmMakefile::ExpandArguments(mf,inArgs,&local_98,(char *)0x0);
        cmConditionEvaluator::cmConditionEvaluator(&local_48,mf);
        local_c0 = mf;
        local_70._24_8_ = inStatus;
        bVar5 = cmConditionEvaluator::IsTrue(&local_48,&local_98,(string *)local_80,&local_c4);
        do {
          if (bVar5 == false) {
LAB_00286864:
            std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
            ~vector(&local_98);
            if ((Internals *)local_80._0_8_ != (Internals *)local_70) {
              operator_delete((void *)local_80._0_8_,CONCAT71(local_70._1_7_,local_70[0]) + 1);
            }
            (**(code **)(*(long *)local_70._16_8_ + 0x18))();
            return true;
          }
          if (local_80._8_8_ != 0) {
            local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_b8,"had incorrect arguments: ","");
            if ((this->Args).
                super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                (this->Args).
                super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
                super__Vector_impl_data._M_start) {
              uVar8 = 0;
              uVar11 = 1;
              do {
                std::__cxx11::string::append((char *)&local_b8);
                std::__cxx11::string::_M_append
                          ((char *)&local_b8,
                           (ulong)(inArgs->
                                  super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                                  )._M_impl.super__Vector_impl_data._M_start[uVar8].Value.
                                  _M_dataplus._M_p);
                std::__cxx11::string::append((char *)&local_b8);
                std::__cxx11::string::append((char *)&local_b8);
                uVar8 = ((long)(this->Args).
                               super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->Args).
                               super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555
                ;
                bVar5 = uVar11 <= uVar8;
                lVar2 = uVar8 - uVar11;
                uVar8 = uVar11;
                uVar11 = (ulong)((int)uVar11 + 1);
              } while (bVar5 && lVar2 != 0);
            }
            std::__cxx11::string::append((char *)&local_b8);
            std::__cxx11::string::_M_append((char *)&local_b8,local_80._0_8_);
            std::__cxx11::string::append((char *)&local_b8);
            MVar3 = local_c4;
            cmMakefile::IssueMessage(local_c0,local_c4,&local_b8);
            if (MVar3 == FATAL_ERROR) {
              cmSystemTools::s_FatalErrorOccured = true;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1
                               );
              }
              goto LAB_00286864;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
              operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
            }
          }
          pcVar7 = (this->Functions).
                   super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if ((this->Functions).
              super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
              super__Vector_impl_data._M_finish != pcVar7) {
            uVar8 = 0;
            uVar11 = 1;
            do {
              local_b8._M_dataplus._M_p = local_b8._M_dataplus._M_p & 0xffffffff00000000;
              cmMakefile::ExecuteCommand(local_c0,pcVar7 + uVar8,(cmExecutionStatus *)&local_b8);
              if ((char)local_b8._M_dataplus._M_p == '\x01') {
                *(bool *)local_70._24_8_ = true;
                goto LAB_00286864;
              }
              if (local_b8._M_dataplus._M_p._1_1_ != '\0') goto LAB_00286864;
              if (local_b8._M_dataplus._M_p._2_1_ != '\0') break;
              if ((cmSystemTools::s_FatalErrorOccured != false) ||
                 (bVar5 = cmSystemTools::GetInterruptFlag(), bVar5)) goto LAB_00286864;
              pcVar7 = (this->Functions).
                       super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              uVar8 = ((long)(this->Functions).
                             super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar7 >> 5) *
                      -0x5555555555555555;
              bVar5 = uVar11 <= uVar8;
              lVar2 = uVar8 - uVar11;
              uVar8 = uVar11;
              uVar11 = (ulong)((int)uVar11 + 1);
            } while (bVar5 && lVar2 != 0);
          }
          pcVar4 = local_98.
                   super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (local_98.
              super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_98.
              super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            local_50 = local_98.
                       super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            paVar9 = &((local_98.
                        super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                        ._M_impl.super__Vector_impl_data._M_start)->Value).field_2;
            do {
              plVar1 = (long *)(((string *)(paVar9 + -1))->_M_dataplus)._M_p;
              if (paVar9 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)plVar1) {
                operator_delete(plVar1,paVar9->_M_allocated_capacity + 1);
              }
              pcVar10 = (pointer)((long)paVar9 + 0x18);
              paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)((long)paVar9 + 0x28);
            } while (pcVar10 != pcVar4);
            local_98.
            super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
            ._M_impl.super__Vector_impl_data._M_finish = local_50;
          }
          cmMakefile::ExpandArguments(local_c0,inArgs,&local_98,(char *)0x0);
          bVar5 = cmConditionEvaluator::IsTrue(&local_48,&local_98,(string *)local_80,&local_c4);
        } while( true );
      }
      this->Depth = this->Depth + -1;
    }
  }
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::push_back
            (&this->Functions,lff);
  return true;
}

Assistant:

bool cmWhileFunctionBlocker::
IsFunctionBlocked(const cmListFileFunction& lff, cmMakefile &mf,
                  cmExecutionStatus &inStatus)
{
  // at end of for each execute recorded commands
  if (!cmSystemTools::Strucmp(lff.Name.c_str(),"while"))
    {
    // record the number of while commands past this one
    this->Depth++;
    }
  else if (!cmSystemTools::Strucmp(lff.Name.c_str(),"endwhile"))
    {
    // if this is the endwhile for this while loop then execute
    if (!this->Depth)
      {
      // Remove the function blocker for this scope or bail.
      cmsys::auto_ptr<cmFunctionBlocker>
        fb(mf.RemoveFunctionBlocker(this, lff));
      if(!fb.get()) { return false; }

      std::string errorString;

      std::vector<cmExpandedCommandArgument> expandedArguments;
      mf.ExpandArguments(this->Args, expandedArguments);
      cmake::MessageType messageType;

      cmConditionEvaluator conditionEvaluator(mf);

      bool isTrue = conditionEvaluator.IsTrue(
        expandedArguments, errorString, messageType);

      while (isTrue)
        {
        if (!errorString.empty())
          {
          std::string err = "had incorrect arguments: ";
          unsigned int i;
          for(i =0; i < this->Args.size(); ++i)
            {
            err += (this->Args[i].Delim?"\"":"");
            err += this->Args[i].Value;
            err += (this->Args[i].Delim?"\"":"");
            err += " ";
            }
          err += "(";
          err += errorString;
          err += ").";
          mf.IssueMessage(messageType, err);
          if (messageType == cmake::FATAL_ERROR)
            {
            cmSystemTools::SetFatalErrorOccured();
            return true;
            }
          }

        // Invoke all the functions that were collected in the block.
        for(unsigned int c = 0; c < this->Functions.size(); ++c)
          {
          cmExecutionStatus status;
          mf.ExecuteCommand(this->Functions[c],status);
          if (status.GetReturnInvoked())
            {
            inStatus.SetReturnInvoked(true);
            return true;
            }
          if (status.GetBreakInvoked())
            {
            return true;
            }
          if (status.GetContinueInvoked())
            {
            break;
            }
          if(cmSystemTools::GetFatalErrorOccured() )
            {
            return true;
            }
          }
        expandedArguments.clear();
        mf.ExpandArguments(this->Args, expandedArguments);
        isTrue = conditionEvaluator.IsTrue(
          expandedArguments, errorString, messageType);
        }
      return true;
      }
    else
      {
      // decrement for each nested while that ends
      this->Depth--;
      }
    }

  // record the command
  this->Functions.push_back(lff);

  // always return true
  return true;
}